

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

char * testing::internal::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  int iVar1;
  size_t __n;
  char *__s2;
  byte in_DL;
  long in_RSI;
  char *in_RDI;
  char *flag_end;
  size_t flag_len;
  string flag_str;
  char *in_stack_ffffffffffffff40;
  char *__s1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_81 [33];
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  char *local_10;
  char *local_8;
  
  local_19 = in_DL & 1;
  if ((in_RDI == (char *)0x0) || (in_RSI == 0)) {
    local_8 = (char *)0x0;
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
    local_10 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_81 + 1),"--",(allocator *)__lhs);
    std::operator+(__lhs,in_stack_ffffffffffffff40);
    std::operator+(__lhs,in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    __n = std::__cxx11::string::length();
    __s1 = local_10;
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strncmp(__s1,__s2,__n);
    if (iVar1 == 0) {
      local_8 = local_10 + __n;
      if (((local_19 & 1) == 0) || (*local_8 != '\0')) {
        if (*local_8 == '=') {
          local_8 = local_8 + 1;
        }
        else {
          local_8 = (char *)0x0;
        }
      }
    }
    else {
      local_8 = (char *)0x0;
    }
    std::__cxx11::string::~string(local_40);
  }
  return local_8;
}

Assistant:

const char* ParseFlagValue(const char* str,
                           const char* flag,
                           bool def_optional) {
  // str and flag must not be NULL.
  if (str == NULL || flag == NULL) return NULL;

  // The flag must start with "--" followed by GTEST_FLAG_PREFIX_.
  const std::string flag_str = std::string("--") + GTEST_FLAG_PREFIX_ + flag;
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return NULL;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return NULL;

  // Returns the string after "=".
  return flag_end + 1;
}